

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void keyboardHandleKey(void *userData,wl_keyboard *keyboard,uint32_t serial,uint32_t time,
                      uint32_t scancode,uint32_t state)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint32_t in_EDX;
  uint32_t in_R8D;
  int in_R9D;
  xkb_keycode_t keycode;
  itimerspec timer;
  int action;
  int key;
  _GLFWwindow *window;
  __time_t in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  _GLFWwindow *in_stack_ffffffffffffffc0;
  long in_stack_ffffffffffffffc8;
  uint32_t scancode_00;
  
  scancode_00 = (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (_glfw.wl.keyboardFocus != (_GLFWwindow *)0x0) {
    iVar1 = translateKey(in_R8D);
    uVar2 = (uint)(in_R9D == 1);
    _glfw.wl.serial = in_EDX;
    memset(&stack0xffffffffffffffb0,0,0x20);
    if (((uVar2 == 1) &&
        (iVar3 = (*_glfw.wl.xkb.keymap_key_repeats)(_glfw.wl.xkb.keymap,in_R8D + 8), iVar3 != 0)) &&
       (0 < _glfw.wl.keyRepeatRate)) {
      if (_glfw.wl.keyRepeatRate < 2) {
        in_stack_ffffffffffffffb0 = 1;
      }
      else {
        in_stack_ffffffffffffffb8 = (long)(int)(1000000000 / (long)_glfw.wl.keyRepeatRate);
      }
      in_stack_ffffffffffffffc0 = (_GLFWwindow *)(long)(_glfw.wl.keyRepeatDelay / 1000);
      scancode_00 = (_glfw.wl.keyRepeatDelay % 1000) * 1000000 >> 0x1f;
      _glfw.wl.keyRepeatScancode = in_R8D;
    }
    timerfd_settime(_glfw.wl.keyRepeatTimerfd,0,(itimerspec *)&stack0xffffffffffffffb0,
                    (itimerspec *)0x0);
    _glfwInputKey(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                  (int)in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                  (int)in_stack_ffffffffffffffb0);
    if (uVar2 == 1) {
      inputText((_GLFWwindow *)CONCAT44(iVar1,1),scancode_00);
    }
  }
  return;
}

Assistant:

static void keyboardHandleKey(void* userData,
                              struct wl_keyboard* keyboard,
                              uint32_t serial,
                              uint32_t time,
                              uint32_t scancode,
                              uint32_t state)
{
    _GLFWwindow* window = _glfw.wl.keyboardFocus;
    if (!window)
        return;

    const int key = translateKey(scancode);
    const int action =
        state == WL_KEYBOARD_KEY_STATE_PRESSED ? GLFW_PRESS : GLFW_RELEASE;

    _glfw.wl.serial = serial;

    struct itimerspec timer = {0};

    if (action == GLFW_PRESS)
    {
        const xkb_keycode_t keycode = scancode + 8;

        if (xkb_keymap_key_repeats(_glfw.wl.xkb.keymap, keycode) &&
            _glfw.wl.keyRepeatRate > 0)
        {
            _glfw.wl.keyRepeatScancode = scancode;
            if (_glfw.wl.keyRepeatRate > 1)
                timer.it_interval.tv_nsec = 1000000000 / _glfw.wl.keyRepeatRate;
            else
                timer.it_interval.tv_sec = 1;

            timer.it_value.tv_sec = _glfw.wl.keyRepeatDelay / 1000;
            timer.it_value.tv_nsec = (_glfw.wl.keyRepeatDelay % 1000) * 1000000;
        }
    }

    timerfd_settime(_glfw.wl.keyRepeatTimerfd, 0, &timer, NULL);

    _glfwInputKey(window, key, scancode, action, _glfw.wl.xkb.modifiers);

    if (action == GLFW_PRESS)
        inputText(window, scancode);
}